

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.hpp
# Opt level: O2

void __thiscall Camera::Camera(Camera *this,Json *conf)

{
  bool bVar1;
  const_reference pvVar2;
  float fVar3;
  vec3f vVar4;
  vector<int,_std::allocator<int>_> resolution;
  _Vector_base<int,_std::allocator<int>_> local_70;
  undefined1 local_58 [32];
  const_iterator local_38;
  
  this->_vptr_Camera = (_func_int **)&PTR___cxa_pure_virtual_00160d48;
  this->mirror = false;
  (this->position).x = 0.0;
  (this->position).y = 0.0;
  *(undefined8 *)&(this->position).z = 0;
  (this->look_at).y = 0.0;
  (this->look_at).z = 0.0;
  (this->up).x = 0.0;
  (this->up).y = 0.0;
  (this->up).z = 0.0;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"resolution");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::get<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_0>
            ((vector<int,_std::allocator<int>_> *)&local_70,pvVar2);
  this->resx = *local_70._M_impl.super__Vector_impl_data._M_start;
  this->resy = local_70._M_impl.super__Vector_impl_data._M_start[1];
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"transform");
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar2,"position");
  vVar4 = json2vec3f(pvVar2);
  (this->position).x = (float)(int)vVar4._0_8_;
  (this->position).y = (float)(int)((ulong)vVar4._0_8_ >> 0x20);
  (this->position).z = vVar4.z;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"transform");
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar2,"look_at");
  vVar4 = json2vec3f(pvVar2);
  (this->look_at).x = (float)(int)vVar4._0_8_;
  (this->look_at).y = (float)(int)((ulong)vVar4._0_8_ >> 0x20);
  (this->look_at).z = vVar4.z;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"transform");
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar2,"up");
  vVar4 = json2vec3f(pvVar2);
  local_58._8_4_ = vVar4.z;
  local_58._0_8_ = vVar4._0_8_;
  vVar4 = normalized((vec3f *)local_58);
  (this->up).x = (float)(int)vVar4._0_8_;
  (this->up).y = (float)(int)((ulong)vVar4._0_8_ >> 0x20);
  (this->up).z = vVar4.z;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"transform");
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[7]>
            ((const_iterator *)local_58,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)pvVar2,(char (*) [7])"mirror");
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"transform");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cend(&local_38,pvVar2);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_58,&local_38);
  if (bVar1) {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"transform");
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar2,"mirror");
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<bool,_bool,_0>(pvVar2);
    this->mirror = bVar1;
  }
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"fov");
  fVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<float,_float,_0>(pvVar2);
  this->fov = (fVar3 / 180.0) * 3.1415927;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
  return;
}

Assistant:

Camera(const Json& conf) {
		std::vector<int> resolution = conf["resolution"];
		resx = resolution[0];
		resy = resolution[1];
		position = json2vec3f(conf["transform"]["position"]);
		look_at = json2vec3f(conf["transform"]["look_at"]);
		up = normalized(json2vec3f(conf["transform"]["up"]));
		if (conf["transform"].find("mirror") != conf["transform"].end())
			mirror = conf["transform"]["mirror"];
		float fov_degree = conf["fov"];
		fov = fov_degree / 180 * PI;
	}